

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O0

TestObject *
TestObject::Create(Recycler *recycler,int pointerCount,size_t extraBytes,CreateOptions options)

{
  code *pcVar1;
  bool bVar2;
  Recycler *pRVar3;
  undefined4 *puVar4;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  size_t local_38;
  size_t size;
  size_t sStack_28;
  CreateOptions options_local;
  size_t extraBytes_local;
  Recycler *pRStack_18;
  int pointerCount_local;
  Recycler *recycler_local;
  
  local_38 = (long)pointerCount * 8 + 0x18 + extraBytes;
  size._4_4_ = options;
  sStack_28 = extraBytes;
  extraBytes_local._4_4_ = pointerCount;
  pRStack_18 = recycler;
  if (options == NormalObj) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&typeinfo,local_38,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
               ,0x93);
    pRVar3 = Memory::Recycler::TrackAllocInfo(recycler,&local_60);
    local_70 = Memory::Recycler::Alloc;
    local_68 = 0;
    pRVar3 = (Recycler *)new<Memory::Recycler>(0x18,pRVar3,0x446fd0,0);
    TestObject((TestObject *)pRVar3,local_38,extraBytes_local._4_4_);
    recycler_local = pRVar3;
  }
  else if (options == LeafObj) {
    if (pointerCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
                         ,0x97,"(pointerCount == 0)","pointerCount == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pRVar3 = pRStack_18;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,(type_info *)&typeinfo,local_38,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
               ,0x98);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_98);
    pRVar3 = (Recycler *)new<Memory::Recycler>(0x18,pRVar3,0x446eb0,0);
    TestObject((TestObject *)pRVar3,local_38,extraBytes_local._4_4_);
    recycler_local = pRVar3;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
                       ,0x9c,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    recycler_local = (Recycler *)0x0;
  }
  return (TestObject *)recycler_local;
}

Assistant:

TestObject* TestObject::Create(Recycler *recycler, int pointerCount, size_t extraBytes, CreateOptions options)
{
    size_t size = sizeof(TestObject)+pointerCount * sizeof(TestObject*) + extraBytes;

    if (options == NormalObj)
    {
        return RecyclerNewPlus(recycler, size, TestObject, size, pointerCount);
    }
    else if (options == LeafObj)
    {
        Assert(pointerCount == 0);
        return RecyclerNewPlusLeaf(recycler, size, TestObject, size, pointerCount);
    }
    else
    {
        Assert(false);
        return nullptr;
    }
}